

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
exr_write_deep_scanline_chunk
          (exr_context_t ctxt,int part_index,int y,void *packed_data,uint64_t packed_size,
          uint64_t unpacked_size,void *sample_data,uint64_t sample_data_size)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  exr_context_t nonc;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar1;
    }
    if (ctxt->parts[(uint)part_index]->storage_mode == EXR_STORAGE_SCANLINE) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->standard_error)(ctxt,0x1d);
      return eVar1;
    }
    eVar1 = write_scan_chunk(ctxt,part_index,ctxt->parts[(uint)part_index],y,packed_data,packed_size
                             ,unpacked_size,sample_data,sample_data_size);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_write_deep_scanline_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           y,
    const void*   packed_data,
    uint64_t      packed_size,
    uint64_t      unpacked_size,
    const void*   sample_data,
    uint64_t      sample_data_size)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_SCANLINE)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_USE_SCAN_NONDEEP_WRITE));

    rv = write_scan_chunk (
        ctxt,
        part_index,
        part,
        y,
        packed_data,
        packed_size,
        unpacked_size,
        sample_data,
        sample_data_size);
    return EXR_UNLOCK_AND_RETURN (rv);
}